

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondPersistence.cpp
# Opt level: O1

void __thiscall OpenMD::HBondPersistence::postCorrelate(HBondPersistence *this)

{
  int iVar1;
  pointer pdVar2;
  pointer piVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = (ulong)(this->super_TimeCorrFunc<double>).nTimeBins_;
  if (uVar4 != 0) {
    pdVar2 = (this->super_TimeCorrFunc<double>).histogram_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar3 = (this->super_TimeCorrFunc<double>).count_.super__Vector_base<int,_std::allocator<int>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      iVar1 = piVar3[uVar5];
      if (iVar1 < 1) {
        pdVar2[uVar5] = 0.0;
      }
      else {
        pdVar2[uVar5] = pdVar2[uVar5] / (double)iVar1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  return;
}

Assistant:

void HBondPersistence::postCorrelate() {
    for (unsigned int i = 0; i < nTimeBins_; ++i) {
      if (count_[i] > 0) {
        histogram_[i] /= count_[i];
      } else {
        histogram_[i] = 0;
      }
    }
  }